

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ExpandAllExtensions
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node)

{
  ulong uVar1;
  ostream *poVar2;
  size_type sVar3;
  shared_ptr<BGIP_BnB_Node> *psVar4;
  shared_ptr<BGIP_BnB_Node> *psVar5;
  shared_ptr<BGIP_BnB_Node> *in_RSI;
  BGIP_BnB_NodePtr *in_RDI;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *unaff_retaddr;
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> JAs;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffff08;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffff10;
  ostream *in_stack_ffffffffffffff20;
  BGIP_BnB_NodePtr *in_stack_ffffffffffffff28;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_ffffffffffffff30;
  shared_ptr<BGIP_BnB_Node> local_90;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar6;
  BGIP_BnB_NodePtr *in_stack_ffffffffffffff88;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_ffffffffffffff90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  vector local_30 [36];
  BGIP_BnB_NodePtr *node_00;
  
  unique0x10000333 = in_RSI;
  node_00 = in_RDI;
  if (3 < *(int *)&in_RDI[0x11].px) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "BGIP_SolverBranchAndBound Expanding the following node: ");
    boost::shared_ptr<BGIP_BnB_Node>::operator->(in_RSI);
    BGIP_BnB_Node::SoftPrint_abi_cxx11_(local_30);
    poVar2 = std::operator<<(poVar2,(string *)local_30);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_30);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x162589);
  boost::shared_ptr<BGIP_BnB_Node>::shared_ptr(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ComputeValidJointActionExtensions
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x1625c3);
  if (3 < *(int *)&in_RDI[0x11].px) {
    in_stack_ffffffffffffff30 =
         (BGIP_SolverBranchAndBound<JointPolicyPureVector> *)
         std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound found ");
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_58);
    in_stack_ffffffffffffff28 =
         (BGIP_BnB_NodePtr *)std::ostream::operator<<((ostream *)in_stack_ffffffffffffff30,sVar3);
    in_stack_ffffffffffffff20 =
         std::operator<<((ostream *)in_stack_ffffffffffffff28," joint action extensions");
    std::ostream::operator<<(in_stack_ffffffffffffff20,std::endl<char,std::char_traits<char>>);
  }
  boost::shared_ptr<BGIP_BnB_Node>::shared_ptr(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  Pop(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x1626b1);
  uVar6 = 0;
  while( true ) {
    psVar4 = (shared_ptr<BGIP_BnB_Node> *)(ulong)uVar6;
    psVar5 = (shared_ptr<BGIP_BnB_Node> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_58);
    if (psVar4 == psVar5) break;
    boost::shared_ptr<BGIP_BnB_Node>::shared_ptr(psVar4,&local_90);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_58,(ulong)uVar6);
    psVar4 = stack0xfffffffffffffff0;
    uVar1 = (ulong)stack0xfffffffffffffff0 >> 0x20;
    Expand(unaff_retaddr,node_00,(Index)uVar1);
    stack0xfffffffffffffff0 = psVar4;
    boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x162722);
    uVar6 = uVar6 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff20);
  return;
}

Assistant:

void ExpandAllExtensions(BGIP_BnB_NodePtr node)
    {
        if(_m_verbosity>3)
            std::cout << "BGIP_SolverBranchAndBound Expanding the following node: "
                      << node->SoftPrint(_m_jtIndexMapping) << std::endl;
        // find the valid extensions of this node
        // no by value for std::vectors!
        //std::vector<Index> JAs=
        //ComputeValidJointActionExtensions(node);
        std::vector<Index> JAs;
        ComputeValidJointActionExtensions(node, JAs);
        if(_m_verbosity>3)
            std::cout << "BGIP_SolverBranchAndBound found " << JAs.size()
                      << " joint action extensions" << std::endl;
        
        Pop(node);

        for(Index i=0;i!=JAs.size();++i)
        {
            Expand(node,JAs[i]);
        }

    //    _m_closedQueueIntermediateNodes->push(node);
    }